

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O3

void __thiscall iutest::detail::IUStreamCapture::IUStreamCapture(IUStreamCapture *this,int fd)

{
  bool bVar1;
  int iVar2;
  undefined1 auStack_1a8 [400];
  
  (this->m_tempfile).super_IFile.super_IOutStream._vptr_IOutStream =
       (_func_int **)&PTR__TempFile_00134a78;
  (this->m_tempfile).super_IFile.super_IInStream._vptr_IInStream =
       (_func_int **)&PTR__TempFile_00134ac8;
  (this->m_tempfile).m_file.super_IFile.super_IOutStream._vptr_IOutStream =
       (_func_int **)&PTR__StdioFile_00134b70;
  (this->m_tempfile).m_file.super_IFile.super_IInStream._vptr_IInStream =
       (_func_int **)&PTR__StdioFile_00134bc0;
  (this->m_tempfile).m_file.m_fp = (FILE *)0x0;
  (this->m_tempfile).m_fd = -1;
  (this->m_tempfile).m_filename._M_dataplus._M_p = (pointer)&(this->m_tempfile).m_filename.field_2;
  (this->m_tempfile).m_filename._M_string_length = 0;
  (this->m_tempfile).m_filename.field_2._M_local_buf[0] = '\0';
  this->m_fd = fd;
  iVar2 = dup(fd);
  this->m_prev_fd = iVar2;
  this->m_new_fd = -1;
  if (iVar2 == -1) {
    IUTestLog::IUTestLog
              ((IUTestLog *)auStack_1a8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
               ,0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(auStack_1a8 + 0x18),"file descriptor dup failed",0x1a);
    IUTestLog::~IUTestLog((IUTestLog *)auStack_1a8);
  }
  else {
    bVar1 = TempFile::Create(&this->m_tempfile,"iutest_stream_capture");
    if (!bVar1) {
      IUTestLog::IUTestLog
                ((IUTestLog *)auStack_1a8,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
                 ,0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(auStack_1a8 + 0x18),"temp file open failed",0x15);
      IUTestLog::~IUTestLog((IUTestLog *)auStack_1a8);
    }
    iVar2 = (this->m_tempfile).m_fd;
    this->m_new_fd = iVar2;
    iVar2 = dup2(iVar2,fd);
    if (iVar2 == -1) {
      IUTestLog::IUTestLog
                ((IUTestLog *)auStack_1a8,LOG_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
                 ,0x35);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(auStack_1a8 + 0x18),"file descriptor dup2 failed",0x1b);
      IUTestLog::~IUTestLog((IUTestLog *)auStack_1a8);
      Close(this);
    }
    TempFile::Close(&this->m_tempfile);
  }
  return;
}

Assistant:

explicit IUStreamCapture(int fd)
        : m_fd(fd), m_prev_fd(internal::posix::Dup(fd)), m_new_fd(-1)
    {
        if( m_prev_fd == -1 )
        {
            IUTEST_LOG_(WARNING) << "file descriptor dup failed";
        }
        else
        {
            if( !m_tempfile.Create("iutest_stream_capture") )
            {
                IUTEST_LOG_(WARNING) << "temp file open failed";
            }
            m_new_fd = m_tempfile.GetDescriptor();
            if( internal::posix::Dup2(m_new_fd, fd) == -1 )
            {
                IUTEST_LOG_(WARNING) << "file descriptor dup2 failed";
                Close();
            }
            m_tempfile.Close();
        }
    }